

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fstack.cpp
# Opt level: O0

void fstk_RunFor(char *symName,int32_t start,int32_t stop,int32_t step,int32_t reptLineNo,char *body
                ,size_t size)

{
  bool bVar1;
  Symbol *pSVar2;
  char *pcVar3;
  int *piVar4;
  uint32_t local_34;
  uint32_t count;
  Symbol *sym;
  char *body_local;
  int32_t reptLineNo_local;
  int32_t step_local;
  int32_t stop_local;
  int32_t start_local;
  char *symName_local;
  
  pSVar2 = sym_AddVar(symName,start);
  if (pSVar2->type == SYM_VAR) {
    local_34 = 0;
    if ((step < 1) || (stop <= start)) {
      if ((step < 0) && (stop < start)) {
        local_34 = (int)((((long)start - (long)stop) + -1) / -(long)step) + 1;
      }
      else if (step == 0) {
        error("FOR cannot have a step value of 0\n");
      }
    }
    else {
      local_34 = (int)((((long)stop - (long)start) + -1) / (long)step) + 1;
    }
    if (((0 < step) && (stop < start)) || ((step < 0 && (start < stop)))) {
      warning(WARNING_BACKWARDS_FOR,"FOR goes backwards from %d to %d by %d\n",(ulong)(uint)start,
              (ulong)(uint)stop,(ulong)(uint)step);
    }
    if ((local_34 != 0) && (bVar1 = newReptContext(reptLineNo,body,size), bVar1)) {
      contextStack->nbReptIters = local_34;
      contextStack->forValue = start;
      contextStack->forStep = step;
      pcVar3 = strdup(symName);
      contextStack->forName = pcVar3;
      if (contextStack->forName == (char *)0x0) {
        piVar4 = __errno_location();
        pcVar3 = strerror(*piVar4);
        fatalerror("Not enough memory for FOR symbol name: %s\n",pcVar3);
      }
    }
  }
  return;
}

Assistant:

void fstk_RunFor(char const *symName, int32_t start, int32_t stop, int32_t step,
		     int32_t reptLineNo, char *body, size_t size)
{
	struct Symbol *sym = sym_AddVar(symName, start);

	if (sym->type != SYM_VAR)
		return;

	uint32_t count = 0;

	if (step > 0 && start < stop)
		count = ((int64_t)stop - start - 1) / step + 1;
	else if (step < 0 && stop < start)
		count = ((int64_t)start - stop - 1) / -(int64_t)step + 1;
	else if (step == 0)
		error("FOR cannot have a step value of 0\n");

	if ((step > 0 && start > stop) || (step < 0 && start < stop))
		warning(WARNING_BACKWARDS_FOR, "FOR goes backwards from %d to %d by %d\n",
			start, stop, step);

	if (count == 0)
		return;
	if (!newReptContext(reptLineNo, body, size))
		return;

	contextStack->nbReptIters = count;
	contextStack->forValue = start;
	contextStack->forStep = step;
	contextStack->forName = strdup(symName);
	if (!contextStack->forName)
		fatalerror("Not enough memory for FOR symbol name: %s\n", strerror(errno));
}